

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O2

int main(int argc,char **argv)

{
  int status;
  int iVar1;
  uint uVar2;
  lua_State *L;
  
  L = luaL_newstate();
  if (L == (lua_State *)0x0) {
    l_message(*argv,"cannot create state: not enough memory");
    uVar2 = 1;
  }
  else {
    lua_pushcclosure(L,pmain,0);
    lua_pushinteger(L,(long)argc);
    lua_pushlightuserdata(L,argv);
    status = lua_pcallk(L,2,1,0,0,(lua_KFunction)0x0);
    iVar1 = lua_toboolean(L,-1);
    report(L,status);
    lua_close(L);
    uVar2 = (uint)(status != 0 || iVar1 == 0);
  }
  return uVar2;
}

Assistant:

int main(int argc, char **argv) {
    int status, result;
    lua_State *L = luaL_newstate();  /* create state */
    if (L == NULL) {
        l_message(argv[0], "cannot create state: not enough memory");
        return EXIT_FAILURE;
    }
    lua_pushcfunction(L, &pmain);  /* to call 'pmain' in protected mode */
    lua_pushinteger(L, argc);  /* 1st argument */
    lua_pushlightuserdata(L, argv); /* 2nd argument */
    status = lua_pcall(L, 2, 1, 0);  /* do the call */
    result = lua_toboolean(L, -1);  /* get result */
    report(L, status);
    lua_close(L);
    return (result && status == LUA_OK) ? EXIT_SUCCESS : EXIT_FAILURE;
}